

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O3

void skipSpaces(void)

{
  byte bVar1;
  char *pcVar2;
  
  pcVar2 = p;
  while( true ) {
    while( true ) {
      bVar1 = *p;
      if ((1 < bVar1 - 9) && (bVar1 != 0x20)) break;
      pcVar2 = pcVar2 + 1;
      p = p + 1;
    }
    pcVar2 = pcVar2 + 1;
    if (bVar1 != 0x22) break;
    while( true ) {
      p = pcVar2;
      pcVar2 = p + 1;
      if (*p == '\"') break;
      if (*p == '\0') {
        inputPosition = inputPosition + 3;
        parseError("unterminated comment");
      }
    }
    inputPosition = inputPosition + 4;
    p = pcVar2;
  }
  inputPosition = inputPosition + 1;
  return;
}

Assistant:

void skipSpaces()
{
    while ((*p == ' ') || (*p == '\t') || (*p == '\n'))
        p++; inputPosition++;
    if (*p == '\"') {
        p++; inputPosition++;
        while (*p && (*p != '\"'))
            p++; inputPosition++;
        if (*p != '\"')
            parseError("unterminated comment");
        p++; inputPosition++;
        skipSpaces();
    }
}